

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.h
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3423::ShapeFunctionsDerivativeX
          (ChElementShellANCF_3423 *this,ShapeVector *Nx,double x,double y,double z)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = this->m_lenX;
  dVar6 = -2.0 / dVar5;
  dVar2 = dVar6 * 0.25;
  dVar4 = 1.0 - y;
  dVar1 = this->m_thickness;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[0] =
       dVar4 * dVar2;
  dVar1 = z * dVar1 * 0.5 * 0.25;
  dVar6 = dVar6 * dVar1;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[1] =
       dVar4 * dVar6;
  dVar5 = 2.0 / dVar5;
  dVar3 = dVar5 * 0.25;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[2] =
       dVar4 * dVar3;
  dVar5 = dVar5 * dVar1;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[3] =
       dVar4 * dVar5;
  dVar1 = y + 1.0;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[4] =
       dVar1 * dVar3;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[5] =
       dVar1 * dVar5;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[6] =
       dVar1 * dVar2;
  (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array[7] =
       dVar1 * dVar6;
  return;
}

Assistant:

double GetLengthX() const { return m_lenX; }